

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::CollectTargetDepends(cmComputeTargetDepends *this,int depender_index)

{
  cmGeneratorTarget *this_00;
  cmake *this_01;
  TargetType TVar1;
  cmLinkImplementation *pcVar2;
  string *psVar3;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *psVar4;
  _Base_ptr p_Var5;
  pointer config;
  pointer dependee_name;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  pointer ppcVar6;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  allocator local_139;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted_1;
  string objLib;
  string local_a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_50;
  
  this_00 = (this->Targets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start[depender_index];
  TVar1 = cmGeneratorTarget::GetType(this_00);
  if (TVar1 != INTERFACE_LIBRARY) {
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cmMakefile::GetConfigurations(&local_50,this_00->Makefile,&configs,true);
    std::__cxx11::string::~string((string *)&local_50);
    if (configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&emitted_1,"",(allocator *)&objLib);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&configs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&emitted_1);
      std::__cxx11::string::~string((string *)&emitted_1);
    }
    for (config = configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        config != configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; config = config + 1) {
      objectFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      objectFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      objectFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetExternalObjects(this_00,&objectFiles,config);
      for (ppcVar6 = objectFiles.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppcVar6 !=
          objectFiles.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
        cmSourceFile::GetObjectLibrary_abi_cxx11_(&objLib,*ppcVar6);
        if (objLib._M_string_length != 0) {
          pVar7 = std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&emitted,&objLib);
          if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            TVar1 = cmGeneratorTarget::GetType(this_00);
            if (TVar1 != EXECUTABLE) {
              TVar1 = cmGeneratorTarget::GetType(this_00);
              if (TVar1 != STATIC_LIBRARY) {
                TVar1 = cmGeneratorTarget::GetType(this_00);
                if (TVar1 != SHARED_LIBRARY) {
                  TVar1 = cmGeneratorTarget::GetType(this_00);
                  if (TVar1 != MODULE_LIBRARY) {
                    this_01 = this->GlobalGenerator->CMakeInstance;
                    std::__cxx11::string::string
                              ((string *)&local_a0,
                               "Only executables and non-OBJECT libraries may reference target objects."
                               ,&local_139);
                    cmGeneratorTarget::GetBacktrace((cmListFileBacktrace *)&emitted_1,this_00);
                    cmake::IssueMessage(this_01,FATAL_ERROR,&local_a0,
                                        (cmListFileBacktrace *)&emitted_1,false);
                    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&emitted_1);
                    std::__cxx11::string::~string((string *)&local_a0);
                    std::__cxx11::string::~string((string *)&objLib);
                    std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::
                    ~_Vector_base(&objectFiles.
                                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                 );
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&configs);
                    this_02 = &emitted._M_t;
                    goto LAB_003c00e8;
                  }
                }
              }
            }
            cmTarget::AddUtility(this_00->Target,&objLib,(cmMakefile *)0x0);
          }
        }
        std::__cxx11::string::~string((string *)&objLib);
      }
      pcVar2 = cmGeneratorTarget::GetLinkImplementation(this_00,config);
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&emitted,psVar3);
      for (dependee_name =
                (pcVar2->super_cmLinkImplementationLibraries).Libraries.
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_start;
          dependee_name !=
          (pcVar2->super_cmLinkImplementationLibraries).Libraries.
          super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
          super__Vector_impl_data._M_finish; dependee_name = dependee_name + 1) {
        pVar7 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&emitted,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           dependee_name);
        if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          AddTargetDepend(this,depender_index,&dependee_name->super_cmLinkItem,true);
          AddInterfaceDepends(this,depender_index,&dependee_name->super_cmLinkItem,&emitted);
        }
      }
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&objectFiles.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configs);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&emitted._M_t);
    psVar4 = cmGeneratorTarget::GetUtilityItems(this_00);
    emitted_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &emitted_1._M_t._M_impl.super__Rb_tree_header._M_header;
    emitted_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emitted_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    emitted_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    emitted_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         emitted_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&emitted_1,psVar3);
    for (p_Var5 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      pVar7 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&emitted_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var5 + 1));
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        AddTargetDepend(this,depender_index,(cmLinkItem *)(p_Var5 + 1),false);
      }
    }
    this_02 = &emitted_1._M_t;
LAB_003c00e8:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(this_02);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargetDepends(int depender_index)
{
  // Get the depender.
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (depender->GetType() == cmState::INTERFACE_LIBRARY)
    {
    return;
    }

  // Loop over all targets linked directly in all configs.
  // We need to make targets depend on the union of all config-specific
  // dependencies in all targets, because the generated build-systems can't
  // deal with config-specific dependencies.
  {
  std::set<std::string> emitted;

  std::vector<std::string> configs;
  depender->Makefile->GetConfigurations(configs);
  if (configs.empty())
    {
    configs.push_back("");
    }
  for (std::vector<std::string>::const_iterator it = configs.begin();
    it != configs.end(); ++it)
    {
    std::vector<cmSourceFile const*> objectFiles;
    depender->GetExternalObjects(objectFiles, *it);
    for(std::vector<cmSourceFile const*>::const_iterator
        oi = objectFiles.begin(); oi != objectFiles.end(); ++oi)
      {
      std::string objLib = (*oi)->GetObjectLibrary();
      if (!objLib.empty() && emitted.insert(objLib).second)
        {
        if(depender->GetType() != cmState::EXECUTABLE &&
            depender->GetType() != cmState::STATIC_LIBRARY &&
            depender->GetType() != cmState::SHARED_LIBRARY &&
            depender->GetType() != cmState::MODULE_LIBRARY)
          {
          this->GlobalGenerator->GetCMakeInstance()
            ->IssueMessage(cmake::FATAL_ERROR,
                            "Only executables and non-OBJECT libraries may "
                            "reference target objects.",
                            depender->GetBacktrace());
          return;
          }
        const_cast<cmGeneratorTarget*>(depender)->Target->AddUtility(objLib);
        }
      }

    cmLinkImplementation const* impl = depender->GetLinkImplementation(*it);

    // A target should not depend on itself.
    emitted.insert(depender->GetName());
    for(std::vector<cmLinkImplItem>::const_iterator
          lib = impl->Libraries.begin();
        lib != impl->Libraries.end(); ++lib)
      {
      // Don't emit the same library twice for this target.
      if(emitted.insert(*lib).second)
        {
        this->AddTargetDepend(depender_index, *lib, true);
        this->AddInterfaceDepends(depender_index, *lib, emitted);
        }
      }
    }
  }

  // Loop over all utility dependencies.
  {
  std::set<cmLinkItem> const& tutils = depender->GetUtilityItems();
  std::set<std::string> emitted;
  // A target should not depend on itself.
  emitted.insert(depender->GetName());
  for(std::set<cmLinkItem>::const_iterator util = tutils.begin();
      util != tutils.end(); ++util)
    {
    // Don't emit the same utility twice for this target.
    if(emitted.insert(*util).second)
      {
      this->AddTargetDepend(depender_index, *util, false);
      }
    }
  }
}